

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_merkletree.cpp
# Opt level: O2

void __thiscall TaprootScriptTree_TreeTest3_Test::TestBody(TaprootScriptTree_TreeTest3_Test *this)

{
  Script *tapscript;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  pointer pTVar2;
  bool bVar3;
  ScriptBuilder *pSVar4;
  pointer pTVar5;
  pointer pTVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *pcVar7;
  size_t index;
  ulong uVar8;
  long lVar9;
  initializer_list<cfd::core::ByteData256> __l;
  initializer_list<cfd::core::ByteData256> __l_00;
  ScopedTrace gtest_trace_556;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_14;
  char *exp_str;
  allocator_type local_7d1;
  allocator local_7d0;
  allocator local_7cf;
  allocator local_7ce;
  allocator local_7cd;
  allocator_type local_7cc;
  allocator local_7cb;
  allocator local_7ca;
  allocator local_7c9;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  AssertionResult gtest_ar_9;
  string nodes_str;
  TaprootScriptTree tree_fg;
  Script local_658;
  undefined8 local_620;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_618;
  TaprootScriptTree tree_efg;
  char *exp_hash;
  AssertionResult gtest_ar_16;
  TaprootScriptTree tree_b;
  vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_> exp_list;
  TaprootScriptTree tree;
  ByteData256 hash_abcd;
  SchnorrPubkey schnorr_pubkey1;
  Pubkey pubkey1;
  ByteData256 tweak2;
  ByteData256 tweak1;
  SchnorrPubkey schnorr_pubkey32;
  SchnorrPubkey schnorr_pubkey3;
  SchnorrPubkey schnorr_pubkey2;
  SchnorrPubkey schnorr_pubkey11;
  SchnorrPubkey schnorr_pubkey31;
  SchnorrPubkey schnorr_pubkey22;
  SchnorrPubkey schnorr_pubkey21;
  SchnorrPubkey schnorr_pubkey12;
  Pubkey pubkey3;
  Pubkey pubkey2;
  ByteData256 tweak4;
  ByteData256 tweak3;
  Privkey key;
  Script script_j;
  Script script_e;
  Script script_b;
  Script script_h;
  Script script_g;
  Script script_f;
  Script script_d;
  Script script_c;
  Script script_a;
  
  std::__cxx11::string::string
            ((string *)&tree_fg,"dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8",
             (allocator *)&tree_efg);
  cfd::core::Privkey::Privkey(&key,(string *)&tree_fg,kMainnet,true);
  std::__cxx11::string::~string((string *)&tree_fg);
  std::__cxx11::string::string
            ((string *)&tree_fg,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)&tree_efg);
  cfd::core::ByteData256::ByteData256(&tweak1,(string *)&tree_fg);
  std::__cxx11::string::~string((string *)&tree_fg);
  std::__cxx11::string::string
            ((string *)&tree_fg,"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57",
             (allocator *)&tree_efg);
  cfd::core::ByteData256::ByteData256(&tweak2,(string *)&tree_fg);
  std::__cxx11::string::~string((string *)&tree_fg);
  std::__cxx11::string::string
            ((string *)&tree_fg,"a78120a2d338fce91a49230935e8f000672f9511ee6fa5fc35ef22f0dfc89475",
             (allocator *)&tree_efg);
  cfd::core::ByteData256::ByteData256(&tweak3,(string *)&tree_fg);
  std::__cxx11::string::~string((string *)&tree_fg);
  std::__cxx11::string::string
            ((string *)&tree_fg,"4b79048979258d39c31b10f2bda70a433daa6e42f987089053f00db1d0f94a8e",
             (allocator *)&tree_efg);
  cfd::core::ByteData256::ByteData256(&tweak4,(string *)&tree_fg);
  std::__cxx11::string::~string((string *)&tree_fg);
  cfd::core::Privkey::GeneratePubkey(&pubkey1,&key,true);
  cfd::core::operator+(&pubkey2,&pubkey1,&tweak3);
  cfd::core::operator+(&pubkey3,&pubkey1,&tweak4);
  cfd::core::SchnorrPubkey::FromPubkey(&schnorr_pubkey1,&pubkey1,(bool *)0x0);
  cfd::core::operator+(&schnorr_pubkey11,&schnorr_pubkey1,&tweak1);
  cfd::core::operator+(&schnorr_pubkey12,&schnorr_pubkey1,&tweak2);
  cfd::core::SchnorrPubkey::FromPubkey(&schnorr_pubkey2,&pubkey2,(bool *)0x0);
  cfd::core::operator+(&schnorr_pubkey21,&schnorr_pubkey2,&tweak1);
  cfd::core::operator+(&schnorr_pubkey22,&schnorr_pubkey2,&tweak2);
  cfd::core::SchnorrPubkey::FromPubkey(&schnorr_pubkey3,&pubkey3,(bool *)0x0);
  cfd::core::operator+(&schnorr_pubkey31,&schnorr_pubkey3,&tweak1);
  cfd::core::operator+(&schnorr_pubkey32,&schnorr_pubkey3,&tweak2);
  tree_fg.super_TapBranch._vptr_TapBranch = (_func_int **)&PTR__ScriptBuilder_006f8aa0;
  tree_fg.super_TapBranch.has_leaf_ = false;
  tree_fg.super_TapBranch.leaf_version_ = '\0';
  tree_fg.super_TapBranch._10_6_ = 0;
  tree_fg.super_TapBranch.script_._vptr_Script = (_func_int **)0x0;
  tree_fg.super_TapBranch.script_.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  cfd::core::SchnorrPubkey::GetData((ByteData *)&tree_efg,&schnorr_pubkey1);
  pSVar4 = cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)&tree_fg,(ByteData *)&tree_efg);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build(&script_a,pSVar4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree_efg);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree_fg);
  tree_fg.super_TapBranch._vptr_TapBranch = (_func_int **)&PTR__ScriptBuilder_006f8aa0;
  tree_fg.super_TapBranch.has_leaf_ = false;
  tree_fg.super_TapBranch.leaf_version_ = '\0';
  tree_fg.super_TapBranch._10_6_ = 0;
  tree_fg.super_TapBranch.script_._vptr_Script = (_func_int **)0x0;
  tree_fg.super_TapBranch.script_.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     ((ScriptBuilder *)&tree_fg,(ScriptOperator *)cfd::core::ScriptOperator::OP_TRUE
                     );
  cfd::core::ScriptBuilder::Build(&script_b,pSVar4);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree_fg);
  tree_fg.super_TapBranch._vptr_TapBranch = (_func_int **)&PTR__ScriptBuilder_006f8aa0;
  tree_fg.super_TapBranch.has_leaf_ = false;
  tree_fg.super_TapBranch.leaf_version_ = '\0';
  tree_fg.super_TapBranch._10_6_ = 0;
  tree_fg.super_TapBranch.script_._vptr_Script = (_func_int **)0x0;
  tree_fg.super_TapBranch.script_.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  cfd::core::SchnorrPubkey::GetData((ByteData *)&tree_efg,&schnorr_pubkey11);
  pSVar4 = cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)&tree_fg,(ByteData *)&tree_efg);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build(&script_c,pSVar4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree_efg);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree_fg);
  tree_fg.super_TapBranch._vptr_TapBranch = (_func_int **)&PTR__ScriptBuilder_006f8aa0;
  tree_fg.super_TapBranch.has_leaf_ = false;
  tree_fg.super_TapBranch.leaf_version_ = '\0';
  tree_fg.super_TapBranch._10_6_ = 0;
  tree_fg.super_TapBranch.script_._vptr_Script = (_func_int **)0x0;
  tree_fg.super_TapBranch.script_.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  cfd::core::SchnorrPubkey::GetData((ByteData *)&tree_efg,&schnorr_pubkey11);
  pSVar4 = cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)&tree_fg,(ByteData *)&tree_efg);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIGVERIFY);
  cfd::core::SchnorrPubkey::GetData((ByteData *)&tree_b,&schnorr_pubkey12);
  pSVar4 = cfd::core::ScriptBuilder::operator<<(pSVar4,(ByteData *)&tree_b);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build(&script_d,pSVar4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree_b);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree_efg);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree_fg);
  tree_fg.super_TapBranch._vptr_TapBranch = (_func_int **)&PTR__ScriptBuilder_006f8aa0;
  tree_fg.super_TapBranch.has_leaf_ = false;
  tree_fg.super_TapBranch.leaf_version_ = '\0';
  tree_fg.super_TapBranch._10_6_ = 0;
  tree_fg.super_TapBranch.script_._vptr_Script = (_func_int **)0x0;
  tree_fg.super_TapBranch.script_.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     ((ScriptBuilder *)&tree_fg,(ScriptOperator *)cfd::core::ScriptOperator::OP_TRUE
                     );
  cfd::core::ScriptBuilder::Build(&script_e,pSVar4);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree_fg);
  tree_fg.super_TapBranch._vptr_TapBranch = (_func_int **)&PTR__ScriptBuilder_006f8aa0;
  tree_fg.super_TapBranch.has_leaf_ = false;
  tree_fg.super_TapBranch.leaf_version_ = '\0';
  tree_fg.super_TapBranch._10_6_ = 0;
  tree_fg.super_TapBranch.script_._vptr_Script = (_func_int **)0x0;
  tree_fg.super_TapBranch.script_.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  cfd::core::SchnorrPubkey::GetData((ByteData *)&tree_efg,&schnorr_pubkey21);
  pSVar4 = cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)&tree_fg,(ByteData *)&tree_efg);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build(&script_f,pSVar4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree_efg);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree_fg);
  tree_fg.super_TapBranch._vptr_TapBranch = (_func_int **)&PTR__ScriptBuilder_006f8aa0;
  tree_fg.super_TapBranch.has_leaf_ = false;
  tree_fg.super_TapBranch.leaf_version_ = '\0';
  tree_fg.super_TapBranch._10_6_ = 0;
  tree_fg.super_TapBranch.script_._vptr_Script = (_func_int **)0x0;
  tree_fg.super_TapBranch.script_.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  cfd::core::SchnorrPubkey::GetData((ByteData *)&tree_efg,&schnorr_pubkey22);
  pSVar4 = cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)&tree_fg,(ByteData *)&tree_efg);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build(&script_g,pSVar4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree_efg);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree_fg);
  tree_fg.super_TapBranch._vptr_TapBranch = (_func_int **)&PTR__ScriptBuilder_006f8aa0;
  tree_fg.super_TapBranch.has_leaf_ = false;
  tree_fg.super_TapBranch.leaf_version_ = '\0';
  tree_fg.super_TapBranch._10_6_ = 0;
  tree_fg.super_TapBranch.script_._vptr_Script = (_func_int **)0x0;
  tree_fg.super_TapBranch.script_.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  cfd::core::SchnorrPubkey::GetData((ByteData *)&tree_efg,&schnorr_pubkey31);
  pSVar4 = cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)&tree_fg,(ByteData *)&tree_efg);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIGVERIFY);
  cfd::core::SchnorrPubkey::GetData((ByteData *)&tree_b,&schnorr_pubkey32);
  pSVar4 = cfd::core::ScriptBuilder::operator<<(pSVar4,(ByteData *)&tree_b);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build(&script_h,pSVar4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree_b);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree_efg);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree_fg);
  tree_fg.super_TapBranch._vptr_TapBranch = (_func_int **)&PTR__ScriptBuilder_006f8aa0;
  tree_fg.super_TapBranch.has_leaf_ = false;
  tree_fg.super_TapBranch.leaf_version_ = '\0';
  tree_fg.super_TapBranch._10_6_ = 0;
  tree_fg.super_TapBranch.script_._vptr_Script = (_func_int **)0x0;
  tree_fg.super_TapBranch.script_.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  cfd::core::SchnorrPubkey::GetData((ByteData *)&tree_efg,&schnorr_pubkey32);
  pSVar4 = cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)&tree_fg,(ByteData *)&tree_efg);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build(&script_j,pSVar4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree_efg);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree_fg);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&tree_fg,&script_a);
  testing::internal::CmpHelperEQ<char[69],std::__cxx11::string>
            ((internal *)&tree_efg,
             "\"20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac\"",
             "script_a.GetHex()",
             (char (*) [69])"20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree_fg);
  std::__cxx11::string::~string((string *)&tree_fg);
  if ((char)tree_efg.super_TapBranch._vptr_TapBranch == '\0') {
    testing::Message::Message((Message *)&tree_fg);
    if (tree_efg.super_TapBranch._8_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)tree_efg.super_TapBranch._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree_b,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x1ed,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree_b,(Message *)&tree_fg);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree_b);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree_fg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tree_efg.super_TapBranch.has_leaf_);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&tree_fg,&script_b);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&tree_efg,"\"51\"","script_b.GetHex()",(char (*) [3])0x5ddec2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree_fg);
  std::__cxx11::string::~string((string *)&tree_fg);
  if ((char)tree_efg.super_TapBranch._vptr_TapBranch == '\0') {
    testing::Message::Message((Message *)&tree_fg);
    if (tree_efg.super_TapBranch._8_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)tree_efg.super_TapBranch._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree_b,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x1ee,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree_b,(Message *)&tree_fg);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree_b);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree_fg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tree_efg.super_TapBranch.has_leaf_);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&tree_fg,&script_c);
  testing::internal::CmpHelperEQ<char[69],std::__cxx11::string>
            ((internal *)&tree_efg,
             "\"2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aac\"",
             "script_c.GetHex()",
             (char (*) [69])"2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aac",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree_fg);
  std::__cxx11::string::~string((string *)&tree_fg);
  if ((char)tree_efg.super_TapBranch._vptr_TapBranch == '\0') {
    testing::Message::Message((Message *)&tree_fg);
    if (tree_efg.super_TapBranch._8_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)tree_efg.super_TapBranch._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree_b,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x1ef,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree_b,(Message *)&tree_fg);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree_b);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree_fg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tree_efg.super_TapBranch.has_leaf_);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&tree_fg,&script_d);
  testing::internal::CmpHelperEQ<char[137],std::__cxx11::string>
            ((internal *)&tree_efg,
             "\"2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac\""
             ,"script_d.GetHex()",
             (char (*) [137])
             "2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree_fg);
  std::__cxx11::string::~string((string *)&tree_fg);
  if ((char)tree_efg.super_TapBranch._vptr_TapBranch == '\0') {
    testing::Message::Message((Message *)&tree_fg);
    if (tree_efg.super_TapBranch._8_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)tree_efg.super_TapBranch._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree_b,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x1f0,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree_b,(Message *)&tree_fg);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree_b);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree_fg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tree_efg.super_TapBranch.has_leaf_);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&tree_fg,&script_e);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&tree_efg,"\"51\"","script_e.GetHex()",(char (*) [3])0x5ddec2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree_fg);
  std::__cxx11::string::~string((string *)&tree_fg);
  if ((char)tree_efg.super_TapBranch._vptr_TapBranch == '\0') {
    testing::Message::Message((Message *)&tree_fg);
    if (tree_efg.super_TapBranch._8_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)tree_efg.super_TapBranch._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree_b,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x1f1,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree_b,(Message *)&tree_fg);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree_b);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree_fg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tree_efg.super_TapBranch.has_leaf_);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&tree_fg,&script_f);
  testing::internal::CmpHelperEQ<char[69],std::__cxx11::string>
            ((internal *)&tree_efg,
             "\"2000d134c42fd51c90fa82c6cfdaabd895474d979118525362c0cd236c857e29d9ac\"",
             "script_f.GetHex()",
             (char (*) [69])"2000d134c42fd51c90fa82c6cfdaabd895474d979118525362c0cd236c857e29d9ac",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree_fg);
  std::__cxx11::string::~string((string *)&tree_fg);
  if ((char)tree_efg.super_TapBranch._vptr_TapBranch == '\0') {
    testing::Message::Message((Message *)&tree_fg);
    if (tree_efg.super_TapBranch._8_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)tree_efg.super_TapBranch._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree_b,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x1f2,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree_b,(Message *)&tree_fg);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree_b);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree_fg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tree_efg.super_TapBranch.has_leaf_);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&tree_fg,&script_g);
  testing::internal::CmpHelperEQ<char[69],std::__cxx11::string>
            ((internal *)&tree_efg,
             "\"204a7af8660f2b0bdb92d2ce8b88ab30feb916343228d2e7bd15da02e1f6a31d47ac\"",
             "script_g.GetHex()",
             (char (*) [69])"204a7af8660f2b0bdb92d2ce8b88ab30feb916343228d2e7bd15da02e1f6a31d47ac",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree_fg);
  std::__cxx11::string::~string((string *)&tree_fg);
  if ((char)tree_efg.super_TapBranch._vptr_TapBranch == '\0') {
    testing::Message::Message((Message *)&tree_fg);
    if (tree_efg.super_TapBranch._8_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)tree_efg.super_TapBranch._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree_b,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,499,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree_b,(Message *)&tree_fg);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree_b);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree_fg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tree_efg.super_TapBranch.has_leaf_);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&tree_fg,&script_h);
  testing::internal::CmpHelperEQ<char[137],std::__cxx11::string>
            ((internal *)&tree_efg,
             "\"2008f8280d68e02e807ccffee141c4a6b7ac31d3c283ae0921892d95f691742c44ad20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac\""
             ,"script_h.GetHex()",
             (char (*) [137])
             "2008f8280d68e02e807ccffee141c4a6b7ac31d3c283ae0921892d95f691742c44ad20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree_fg);
  std::__cxx11::string::~string((string *)&tree_fg);
  if ((char)tree_efg.super_TapBranch._vptr_TapBranch == '\0') {
    testing::Message::Message((Message *)&tree_fg);
    if (tree_efg.super_TapBranch._8_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)tree_efg.super_TapBranch._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree_b,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,500,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree_b,(Message *)&tree_fg);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree_b);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree_fg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tree_efg.super_TapBranch.has_leaf_);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&tree_fg,&script_j);
  testing::internal::CmpHelperEQ<char[69],std::__cxx11::string>
            ((internal *)&tree_efg,
             "\"20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac\"",
             "script_j.GetHex()",(char (*) [69])0x48ce00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree_fg);
  std::__cxx11::string::~string((string *)&tree_fg);
  if ((char)tree_efg.super_TapBranch._vptr_TapBranch == '\0') {
    testing::Message::Message((Message *)&tree_fg);
    if (tree_efg.super_TapBranch._8_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)tree_efg.super_TapBranch._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree_b,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x1f5,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree_b,(Message *)&tree_fg);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree_b);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree_fg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tree_efg.super_TapBranch.has_leaf_);
  std::__cxx11::string::string((string *)&tree_fg,"b",(allocator *)&exp_hash);
  cfd::core::Script::Script
            ((Script *)
             ((long)&tree_fg.super_TapBranch.script_.script_data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8),
             &script_b);
  tree_fg.super_TapBranch.root_commitment_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x5;
  std::__cxx11::string::string
            ((string *)&tree,"06b46c960d6824f0da5af71d9ecc55714de5b2d2da51be60bd12c77df20a20df",
             (allocator *)&exp_str);
  cfd::core::ByteData256::ByteData256((ByteData256 *)&tree_efg,(string *)&tree);
  std::__cxx11::string::string
            ((string *)&gtest_ar_9,
             "4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fd",
             (allocator *)&gtest_trace_556);
  cfd::core::ByteData256::ByteData256
            ((ByteData256 *)&tree_efg.super_TapBranch.script_.script_data_,(string *)&gtest_ar_9);
  std::__cxx11::string::string
            ((string *)&nodes_str,"e47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb"
             ,&local_7c9);
  cfd::core::ByteData256::ByteData256
            ((ByteData256 *)&tree_efg.super_TapBranch.script_.script_stack_,&nodes_str);
  std::__cxx11::string::string
            ((string *)&gtest_ar_10,
             "32a0a039ec1412be2803fd7b5f5444c03d498e5e8e107ee431a9597c7b5b3a7c",&local_7ca);
  cfd::core::ByteData256::ByteData256
            (&tree_efg.super_TapBranch.root_commitment_,(string *)&gtest_ar_10);
  std::__cxx11::string::string
            ((string *)&gtest_ar_14,
             "d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75",&local_7cb);
  cfd::core::ByteData256::ByteData256
            ((ByteData256 *)&tree_efg.super_TapBranch.branch_list_,(string *)&gtest_ar_14);
  __l._M_len = 5;
  __l._M_array = (iterator)&tree_efg;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &tree_fg.super_TapBranch.branch_list_,__l,&local_7cc);
  std::__cxx11::string::string((string *)&tree_fg.super_TapBranch.is_elements_,"e",&local_7cd);
  cfd::core::Script::Script(&local_658,&script_e);
  local_620 = 3;
  std::__cxx11::string::string
            ((string *)&hash_abcd,"aaf9ea4cbd2f4606a31a35d563fa371bc630d9d7bcc50f62d064a3d84e0e3086"
             ,&local_7ce);
  cfd::core::ByteData256::ByteData256((ByteData256 *)&tree_b,(string *)&hash_abcd);
  std::__cxx11::string::string
            ((string *)&nodes,"aeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27e",
             &local_7cf);
  cfd::core::ByteData256::ByteData256
            ((ByteData256 *)&tree_b.super_TapBranch.script_.script_data_,(string *)&nodes);
  std::__cxx11::string::string
            ((string *)&gtest_ar_16,
             "d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75",&local_7d0);
  cfd::core::ByteData256::ByteData256
            ((ByteData256 *)&tree_b.super_TapBranch.script_.script_stack_,(string *)&gtest_ar_16);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&tree_b;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            (&local_618,__l_00,&local_7d1);
  exp_list.super__Vector_base<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  exp_list.super__Vector_base<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  exp_list.super__Vector_base<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar5 = (pointer)operator_new(0xf0);
  exp_list.super__Vector_base<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pTVar5 + 2;
  exp_list.super__Vector_base<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>._M_impl.
  super__Vector_impl_data._M_start = pTVar5;
  for (lVar9 = 0; pTVar6 = (pointer)((long)&(pTVar5->name)._M_dataplus._M_p + lVar9), lVar9 != 0xf0;
      lVar9 = lVar9 + 0x78) {
    std::__cxx11::string::string
              ((string *)pTVar6,(string *)((long)&tree_fg.super_TapBranch._vptr_TapBranch + lVar9));
    cfd::core::Script::Script
              ((Script *)((long)&(pTVar5->script)._vptr_Script + lVar9),
               (Script *)
               ((long)&tree_fg.super_TapBranch.script_.script_data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + lVar9 + 8
               ));
    *(undefined8 *)((long)&pTVar5->depth + lVar9) =
         *(undefined8 *)
          ((long)&tree_fg.super_TapBranch.root_commitment_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
          lVar9 + 0x10);
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               ((long)&(pTVar5->nodes).
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar9),
               (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               ((long)&tree_fg.super_TapBranch.branch_list_.
                       super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                       ._M_impl.super__Vector_impl_data + lVar9));
  }
  lVar9 = 0x78;
  exp_list.super__Vector_base<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar6;
  do {
    TestBody::TestScriptTree3Data::~TestScriptTree3Data
              ((TestScriptTree3Data *)((long)&tree_fg.super_TapBranch._vptr_TapBranch + lVar9));
    lVar9 = lVar9 + -0x78;
  } while (lVar9 != -0x78);
  lVar9 = 0x30;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&tree_b.super_TapBranch._vptr_TapBranch + lVar9));
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != -0x18);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&nodes);
  std::__cxx11::string::~string((string *)&hash_abcd);
  lVar9 = 0x60;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&tree_efg.super_TapBranch._vptr_TapBranch + lVar9));
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != -0x18);
  std::__cxx11::string::~string((string *)&gtest_ar_14);
  std::__cxx11::string::~string((string *)&gtest_ar_10);
  std::__cxx11::string::~string((string *)&nodes_str);
  std::__cxx11::string::~string((string *)&gtest_ar_9);
  std::__cxx11::string::~string((string *)&tree);
  exp_hash = "0c1bebfc9a508bf4d5835d401d96d71b72f1873fd338aebfff06d7adbe0c0cc3";
  exp_str = 
  "{{{tl(51),{tl(204a7af8660f2b0bdb92d2ce8b88ab30feb916343228d2e7bd15da02e1f6a31d47ac),tl(2000d134c42fd51c90fa82c6cfdaabd895474d979118525362c0cd236c857e29d9ac)}},{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),{tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aac),tl(51)}},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}},tl(2008f8280d68e02e807ccffee141c4a6b7ac31d3c283ae0921892d95f691742c44ad20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac)}"
  ;
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree_fg,&script_f);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree_efg,&script_g);
  cfd::core::TaprootScriptTree::AddBranch(&tree_fg,&tree_efg);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree_efg);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree_efg,&script_e);
  cfd::core::TaprootScriptTree::AddBranch(&tree_efg,&tree_fg);
  cfd::core::TapBranch::GetCurrentBranchHash((ByteData256 *)&tree,&tree_fg.super_TapBranch);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&tree_b,(ByteData256 *)&tree);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&gtest_ar_9,
             "\"aaf9ea4cbd2f4606a31a35d563fa371bc630d9d7bcc50f62d064a3d84e0e3086\"",
             "tree_fg.GetCurrentBranchHash().GetHex()",
             (char (*) [65])"aaf9ea4cbd2f4606a31a35d563fa371bc630d9d7bcc50f62d064a3d84e0e3086",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree_b);
  std::__cxx11::string::~string((string *)&tree_b);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree);
  if (gtest_ar_9.success_ == false) {
    testing::Message::Message((Message *)&tree_b);
    if (gtest_ar_9.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_9.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x219,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree,(Message *)&tree_b);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree_b);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_9.message_);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree_b,&script_b);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree,&script_c);
  cfd::core::TaprootScriptTree::AddBranch(&tree_b,&tree);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree,&script_a);
  cfd::core::TaprootScriptTree::AddBranch(&tree_b,&tree);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree,&script_d);
  cfd::core::TaprootScriptTree::AddBranch(&tree_b,&tree);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree);
  cfd::core::TapBranch::GetCurrentBranchHash(&hash_abcd,&tree_b.super_TapBranch);
  cfd::core::TaprootScriptTree::AddBranch(&tree_b,&tree_efg);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree,&script_h);
  cfd::core::TaprootScriptTree::AddBranch(&tree_b,&tree);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree,&tree_b);
  cfd::core::TapBranch::GetCurrentBranchHash((ByteData256 *)&nodes_str,&tree.super_TapBranch);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar_9,(ByteData256 *)&nodes_str);
  testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            ((internal *)&gtest_ar_10,"exp_hash","tree.GetCurrentBranchHash().GetHex()",&exp_hash,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_9);
  std::__cxx11::string::~string((string *)&gtest_ar_9);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nodes_str);
  if (gtest_ar_10.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_9);
    if (gtest_ar_10.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_10.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&nodes_str,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x224,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&nodes_str,(Message *)&gtest_ar_9);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nodes_str);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_9);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_10.message_);
  cfd::core::TapBranch::ToString_abi_cxx11_((string *)&gtest_ar_9,&tree.super_TapBranch);
  testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            ((internal *)&nodes_str,"exp_str","tree.ToString()",&exp_str,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_9);
  std::__cxx11::string::~string((string *)&gtest_ar_9);
  if ((char)nodes_str._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_9);
    if (nodes_str._M_string_length == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)nodes_str._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x225,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10,(Message *)&gtest_ar_9);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_9);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&nodes_str._M_string_length);
  nodes_str._M_dataplus._M_p = (pointer)&nodes_str.field_2;
  nodes_str._M_string_length = 0;
  nodes_str.field_2._M_local_buf[0] = '\0';
  cfd::core::TaprootScriptTree::GetNodeList
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&gtest_ar_10
             ,&tree);
  sVar1 = gtest_ar_10.message_;
  for (this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_10._0_8_; this_00 != sVar1.ptr_;
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((this_00->field_2)._M_local_buf + 8)) {
    cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar_9,(ByteData256 *)this_00);
    std::__cxx11::string::append((string *)&nodes_str);
    std::__cxx11::string::~string((string *)&gtest_ar_9);
  }
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&gtest_ar_10
            );
  testing::internal::CmpHelperEQ<char[321],std::__cxx11::string>
            ((internal *)&gtest_ar_9,
             "\"06b46c960d6824f0da5af71d9ecc55714de5b2d2da51be60bd12c77df20a20df4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fde47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb32a0a039ec1412be2803fd7b5f5444c03d498e5e8e107ee431a9597c7b5b3a7cd7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75\""
             ,"nodes_str",
             (char (*) [321])
             "06b46c960d6824f0da5af71d9ecc55714de5b2d2da51be60bd12c77df20a20df4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fde47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb32a0a039ec1412be2803fd7b5f5444c03d498e5e8e107ee431a9597c7b5b3a7cd7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
             ,&nodes_str);
  if (gtest_ar_9.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_10);
    if (gtest_ar_9.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_9.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x228,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14,(Message *)&gtest_ar_10)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_10);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_9.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar_9,&hash_abcd);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&gtest_ar_10,
             "\"aeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27e\"",
             "hash_abcd.GetHex()",
             (char (*) [65])"aeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27e",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_9);
  std::__cxx11::string::~string((string *)&gtest_ar_9);
  if (gtest_ar_10.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_9);
    if (gtest_ar_10.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_10.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x229,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14,(Message *)&gtest_ar_9);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_9);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_10.message_);
  pTVar5 = exp_list.super__Vector_base<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pTVar6 = exp_list.
                super__Vector_base<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>.
                _M_impl.super__Vector_impl_data._M_start; pTVar6 != pTVar5; pTVar6 = pTVar6 + 1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_9,
                   "script_",&pTVar6->name);
    testing::ScopedTrace::ScopedTrace
              (&gtest_trace_556,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x22c,(string *)&gtest_ar_9);
    std::__cxx11::string::~string((string *)&gtest_ar_9);
    nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&gtest_ar_10,exp_str,(allocator *)&gtest_ar_16);
    tapscript = &pTVar6->script;
    gtest_ar_14.success_ = false;
    gtest_ar_14._1_7_ = 0;
    gtest_ar_14.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    cfd::core::TaprootScriptTree::FromString
              ((TaprootScriptTree *)&gtest_ar_9,(string *)&gtest_ar_10,tapscript,
               (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               &gtest_ar_14,kMainnet);
    cfd::core::TaprootScriptTree::operator=(&tree,(TaprootScriptTree *)&gtest_ar_9);
    cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&gtest_ar_9);
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               &gtest_ar_14);
    std::__cxx11::string::~string((string *)&gtest_ar_10);
    cfd::core::TapBranch::GetCurrentBranchHash((ByteData256 *)&gtest_ar_10,&tree.super_TapBranch);
    cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar_9,(ByteData256 *)&gtest_ar_10);
    testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
              ((internal *)&gtest_ar_14,"exp_hash","tree.GetCurrentBranchHash().GetHex()",&exp_hash,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_9);
    std::__cxx11::string::~string((string *)&gtest_ar_9);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_10);
    if (gtest_ar_14.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_9);
      pcVar7 = "";
      if (gtest_ar_14.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = ((gtest_ar_14.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x22f,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_10,(Message *)&gtest_ar_9);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_9);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_14.message_);
    cfd::core::TapBranch::ToString_abi_cxx11_((string *)&gtest_ar_9,&tree.super_TapBranch);
    testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
              ((internal *)&gtest_ar_10,"exp_str","tree.ToString()",&exp_str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_9);
    std::__cxx11::string::~string((string *)&gtest_ar_9);
    if (gtest_ar_10.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_9);
      pcVar7 = "";
      if (gtest_ar_10.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = ((gtest_ar_10.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_14,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x230,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_14,(Message *)&gtest_ar_9);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_9);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_10.message_);
    bVar3 = std::operator==(&pTVar6->name,"b");
    pTVar2 = exp_list.super__Vector_base<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (bVar3) {
      cfd::core::Script::GetHex_abi_cxx11_
                ((string *)&gtest_ar_10,
                 &exp_list.
                  super__Vector_base<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>.
                  _M_impl.super__Vector_impl_data._M_start[1].script);
      cfd::core::TapBranch::GetScript((Script *)&gtest_ar_9,&tree.super_TapBranch);
      cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_14,(Script *)&gtest_ar_9);
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&gtest_ar_16,"exp_list[1].script.GetHex()","tree.GetScript().GetHex()",
                 (string *)&gtest_ar_10,(string *)&gtest_ar_14);
      std::__cxx11::string::~string((string *)&gtest_ar_14);
      cfd::core::Script::~Script((Script *)&gtest_ar_9);
      std::__cxx11::string::~string((string *)&gtest_ar_10);
      if (gtest_ar_16.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_9);
        pcVar7 = "";
        if (gtest_ar_16.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = ((gtest_ar_16.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                   ,0x233,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_10,(Message *)&gtest_ar_9);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_9);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_16.message_);
      cfd::core::TapBranch::GetBranchList
                ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&gtest_ar_9,
                 &tree.super_TapBranch);
      gtest_ar_14._0_8_ =
           (long)gtest_ar_9.message_.ptr_ - CONCAT71(gtest_ar_9._1_7_,gtest_ar_9.success_) >> 7;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar_10,"exp_list[1].depth","tree.GetBranchList().size()",
                 &pTVar2[1].depth,(unsigned_long *)&gtest_ar_14);
      std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
                ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&gtest_ar_9)
      ;
      if (gtest_ar_10.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_9);
        pcVar7 = "";
        if (gtest_ar_10.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = ((gtest_ar_10.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_14,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                   ,0x234,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_14,(Message *)&gtest_ar_9);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_9);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_10.message_);
      cfd::core::TaprootScriptTree::GetNodeList
                ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 &gtest_ar_9,&tree);
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::_M_move_assign
                (&nodes,(TaprootScriptTree *)&gtest_ar_9);
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 &gtest_ar_9);
      gtest_ar_10._0_8_ =
           ((long)pTVar2[1].nodes.
                  super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)pTVar2[1].nodes.
                 super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      gtest_ar_14._0_8_ =
           ((long)nodes.
                  super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)nodes.
                 super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar_9,"exp_list[1].nodes.size()","nodes.size()",
                 (unsigned_long *)&gtest_ar_10,(unsigned_long *)&gtest_ar_14);
      if (gtest_ar_9.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_10);
        pcVar7 = "";
        if (gtest_ar_9.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = ((gtest_ar_9.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_14,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                   ,0x236,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_14,(Message *)&gtest_ar_10);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_10);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_9.message_);
      lVar9 = 0;
      uVar8 = 0;
      while( true ) {
        if ((ulong)(((long)nodes.
                           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)nodes.
                          super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar8) break;
        testing::internal::CmpHelperEQ<cfd::core::ByteData256,cfd::core::ByteData256>
                  ((internal *)&gtest_ar_9,"exp_list[1].nodes[index]","nodes[index]",
                   (ByteData256 *)
                   ((long)&((pTVar2[1].nodes.
                             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                             ._M_impl.super__Vector_impl_data._M_start)->data_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   + lVar9),(ByteData256 *)
                            ((long)&((nodes.
                                      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->data_).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar9));
        if (gtest_ar_9.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_10);
          pcVar7 = "";
          if (gtest_ar_9.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = ((gtest_ar_9.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_14,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                     ,0x238,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_14,(Message *)&gtest_ar_10);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_10);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_9.message_);
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + 0x18;
      }
    }
    else {
      cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_10,tapscript);
      cfd::core::TapBranch::GetScript((Script *)&gtest_ar_9,&tree.super_TapBranch);
      cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_14,(Script *)&gtest_ar_9);
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&gtest_ar_16,"test_data.script.GetHex()","tree.GetScript().GetHex()",
                 (string *)&gtest_ar_10,(string *)&gtest_ar_14);
      std::__cxx11::string::~string((string *)&gtest_ar_14);
      cfd::core::Script::~Script((Script *)&gtest_ar_9);
      std::__cxx11::string::~string((string *)&gtest_ar_10);
      if (gtest_ar_16.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_9);
        pcVar7 = "";
        if (gtest_ar_16.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = ((gtest_ar_16.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                   ,0x23b,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_10,(Message *)&gtest_ar_9);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_9);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_16.message_);
      cfd::core::TapBranch::GetBranchList
                ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&gtest_ar_9,
                 &tree.super_TapBranch);
      gtest_ar_14._0_8_ =
           (long)gtest_ar_9.message_.ptr_ - CONCAT71(gtest_ar_9._1_7_,gtest_ar_9.success_) >> 7;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar_10,"test_data.depth","tree.GetBranchList().size()",
                 &pTVar6->depth,(unsigned_long *)&gtest_ar_14);
      std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
                ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&gtest_ar_9)
      ;
      if (gtest_ar_10.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_9);
        pcVar7 = "";
        if (gtest_ar_10.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = ((gtest_ar_10.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_14,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                   ,0x23c,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_14,(Message *)&gtest_ar_9);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_9);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_10.message_);
      cfd::core::TaprootScriptTree::GetNodeList
                ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 &gtest_ar_9,&tree);
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::_M_move_assign
                (&nodes,(TaprootScriptTree *)&gtest_ar_9);
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 &gtest_ar_9);
      gtest_ar_10._0_8_ =
           ((long)(pTVar6->nodes).
                  super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pTVar6->nodes).
                 super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      gtest_ar_14._0_8_ =
           ((long)nodes.
                  super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)nodes.
                 super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar_9,"test_data.nodes.size()","nodes.size()",
                 (unsigned_long *)&gtest_ar_10,(unsigned_long *)&gtest_ar_14);
      if (gtest_ar_9.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_10);
        pcVar7 = "";
        if (gtest_ar_9.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = ((gtest_ar_9.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_14,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                   ,0x23e,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_14,(Message *)&gtest_ar_10);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_10);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_9.message_);
      lVar9 = 0;
      uVar8 = 0;
      while( true ) {
        if ((ulong)(((long)nodes.
                           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)nodes.
                          super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar8) break;
        testing::internal::CmpHelperEQ<cfd::core::ByteData256,cfd::core::ByteData256>
                  ((internal *)&gtest_ar_9,"test_data.nodes[index]","nodes[index]",
                   (ByteData256 *)
                   ((long)&(((pTVar6->nodes).
                             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                             ._M_impl.super__Vector_impl_data._M_start)->data_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   + lVar9),(ByteData256 *)
                            ((long)&((nodes.
                                      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->data_).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar9));
        if (gtest_ar_9.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_10);
          pcVar7 = "";
          if (gtest_ar_9.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = ((gtest_ar_9.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_14,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                     ,0x240,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_14,(Message *)&gtest_ar_10);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_10);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_9.message_);
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + 0x18;
      }
    }
    std::__cxx11::string::string((string *)&gtest_ar_10,exp_str,(allocator *)&gtest_ar_14);
    cfd::core::TaprootScriptTree::FromString
              ((TaprootScriptTree *)&gtest_ar_9,(string *)&gtest_ar_10,tapscript,&pTVar6->nodes,
               kMainnet);
    cfd::core::TaprootScriptTree::operator=(&tree,(TaprootScriptTree *)&gtest_ar_9);
    cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&gtest_ar_9);
    std::__cxx11::string::~string((string *)&gtest_ar_10);
    cfd::core::TapBranch::GetCurrentBranchHash((ByteData256 *)&gtest_ar_10,&tree.super_TapBranch);
    cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar_9,(ByteData256 *)&gtest_ar_10);
    testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
              ((internal *)&gtest_ar_14,"exp_hash","tree.GetCurrentBranchHash().GetHex()",&exp_hash,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_9);
    std::__cxx11::string::~string((string *)&gtest_ar_9);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_10);
    if (gtest_ar_14.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_9);
      pcVar7 = "";
      if (gtest_ar_14.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = ((gtest_ar_14.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x247,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_10,(Message *)&gtest_ar_9);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_9);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_14.message_);
    cfd::core::TapBranch::ToString_abi_cxx11_((string *)&gtest_ar_9,&tree.super_TapBranch);
    testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
              ((internal *)&gtest_ar_10,"exp_str","tree.ToString()",&exp_str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_9);
    std::__cxx11::string::~string((string *)&gtest_ar_9);
    if (gtest_ar_10.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_9);
      pcVar7 = "";
      if (gtest_ar_10.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = ((gtest_ar_10.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_14,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x248,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_14,(Message *)&gtest_ar_9);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_9);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_10.message_);
    cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_10,tapscript);
    cfd::core::TapBranch::GetScript((Script *)&gtest_ar_9,&tree.super_TapBranch);
    cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_14,(Script *)&gtest_ar_9);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_16,"test_data.script.GetHex()","tree.GetScript().GetHex()",
               (string *)&gtest_ar_10,(string *)&gtest_ar_14);
    std::__cxx11::string::~string((string *)&gtest_ar_14);
    cfd::core::Script::~Script((Script *)&gtest_ar_9);
    std::__cxx11::string::~string((string *)&gtest_ar_10);
    if (gtest_ar_16.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_9);
      pcVar7 = "";
      if (gtest_ar_16.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = ((gtest_ar_16.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x249,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_10,(Message *)&gtest_ar_9);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_9);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_16.message_);
    cfd::core::TapBranch::GetBranchList
              ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&gtest_ar_9,
               &tree.super_TapBranch);
    gtest_ar_14._0_8_ =
         (long)gtest_ar_9.message_.ptr_ - CONCAT71(gtest_ar_9._1_7_,gtest_ar_9.success_) >> 7;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_10,"test_data.depth","tree.GetBranchList().size()",
               &pTVar6->depth,(unsigned_long *)&gtest_ar_14);
    std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
              ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&gtest_ar_9);
    if (gtest_ar_10.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_9);
      pcVar7 = "";
      if (gtest_ar_10.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = ((gtest_ar_10.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_14,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x24a,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_14,(Message *)&gtest_ar_9);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_9);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_10.message_);
    cfd::core::TaprootScriptTree::GetNodeList
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               &gtest_ar_9,&tree);
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::_M_move_assign
              (&nodes,(TaprootScriptTree *)&gtest_ar_9);
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               &gtest_ar_9);
    gtest_ar_10._0_8_ =
         ((long)(pTVar6->nodes).
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_finish -
         (long)(pTVar6->nodes).
               super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
               _M_impl.super__Vector_impl_data._M_start) / 0x18;
    gtest_ar_14._0_8_ =
         ((long)nodes.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_finish -
         (long)nodes.
               super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
               _M_impl.super__Vector_impl_data._M_start) / 0x18;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_9,"test_data.nodes.size()","nodes.size()",
               (unsigned_long *)&gtest_ar_10,(unsigned_long *)&gtest_ar_14);
    if (gtest_ar_9.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_10);
      pcVar7 = "";
      if (gtest_ar_9.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = ((gtest_ar_9.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_14,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x24c,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_14,(Message *)&gtest_ar_10);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_10);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_9.message_);
    lVar9 = 0;
    uVar8 = 0;
    while( true ) {
      if ((ulong)(((long)nodes.
                         super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)nodes.
                        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar8) break;
      testing::internal::CmpHelperEQ<cfd::core::ByteData256,cfd::core::ByteData256>
                ((internal *)&gtest_ar_9,"test_data.nodes[index]","nodes[index]",
                 (ByteData256 *)
                 ((long)&(((pTVar6->nodes).
                           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                           ._M_impl.super__Vector_impl_data._M_start)->data_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
                 lVar9),(ByteData256 *)
                        ((long)&((nodes.
                                  super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->data_).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar9));
      if (gtest_ar_9.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_10);
        pcVar7 = "";
        if (gtest_ar_9.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = ((gtest_ar_9.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_14,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                   ,0x24e,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_14,(Message *)&gtest_ar_10);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_10);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_9.message_);
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x18;
    }
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&nodes);
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_556);
  }
  std::__cxx11::string::string((string *)&gtest_ar_10,exp_str,(allocator *)&nodes);
  gtest_ar_14.success_ = false;
  gtest_ar_14._1_7_ = 0;
  gtest_ar_14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  cfd::core::TaprootScriptTree::FromString
            ((TaprootScriptTree *)&gtest_ar_9,(string *)&gtest_ar_10,&script_j,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&gtest_ar_14
             ,kMainnet);
  cfd::core::TaprootScriptTree::operator=(&tree,(TaprootScriptTree *)&gtest_ar_9);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&gtest_ar_9);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&gtest_ar_14
            );
  std::__cxx11::string::~string((string *)&gtest_ar_10);
  cfd::core::TapBranch::GetScript((Script *)&gtest_ar_9,&tree.super_TapBranch);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_10,(Script *)&gtest_ar_9);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar_14,"\"xxx\"","tree.GetScript().GetHex()",(char (*) [4])0x47f673,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_10);
  std::__cxx11::string::~string((string *)&gtest_ar_10);
  cfd::core::Script::~Script((Script *)&gtest_ar_9);
  if (gtest_ar_14.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_9);
    if (gtest_ar_14.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_14.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,599,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10,(Message *)&gtest_ar_9);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_9);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_14.message_);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_9,&script_j);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar_10,"\"xxx\"","script_j.GetHex()",(char (*) [4])0x47f673,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_9);
  std::__cxx11::string::~string((string *)&gtest_ar_9);
  if (gtest_ar_10.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_9);
    if (gtest_ar_10.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_10.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,600,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14,(Message *)&gtest_ar_9);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_9);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_10.message_);
  std::__cxx11::string::~string((string *)&nodes_str);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hash_abcd);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree_b);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree_efg);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree_fg);
  std::vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>::~vector(&exp_list);
  cfd::core::Script::~Script(&script_j);
  cfd::core::Script::~Script(&script_h);
  cfd::core::Script::~Script(&script_g);
  cfd::core::Script::~Script(&script_f);
  cfd::core::Script::~Script(&script_e);
  cfd::core::Script::~Script(&script_d);
  cfd::core::Script::~Script(&script_c);
  cfd::core::Script::~Script(&script_b);
  cfd::core::Script::~Script(&script_a);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey32);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey31);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey22);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey21);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey12);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey11);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  return;
}

Assistant:

TEST(TaprootScriptTree, TreeTest3) {
  //        /\        //
  //       /\ H       //
  //      /  \        //
  //     /\  /\       //
  //    /  D E \      //
  //   / \     /\     //
  //  A   /\  F  G    //
  //     B  C         //
  Privkey key("dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8");
  ByteData256 tweak1("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  ByteData256 tweak2("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57");
  ByteData256 tweak3("a78120a2d338fce91a49230935e8f000672f9511ee6fa5fc35ef22f0dfc89475");
  ByteData256 tweak4("4b79048979258d39c31b10f2bda70a433daa6e42f987089053f00db1d0f94a8e");
  Pubkey pubkey1 = key.GeneratePubkey();
  Pubkey pubkey2 = pubkey1 + tweak3;
  Pubkey pubkey3 = pubkey1 + tweak4;
  SchnorrPubkey schnorr_pubkey1 = SchnorrPubkey::FromPubkey(pubkey1);
  SchnorrPubkey schnorr_pubkey11 = schnorr_pubkey1 + tweak1;
  SchnorrPubkey schnorr_pubkey12 = schnorr_pubkey1 + tweak2;
  SchnorrPubkey schnorr_pubkey2 = SchnorrPubkey::FromPubkey(pubkey2);
  SchnorrPubkey schnorr_pubkey21 = schnorr_pubkey2 + tweak1;
  SchnorrPubkey schnorr_pubkey22 = schnorr_pubkey2 + tweak2;
  SchnorrPubkey schnorr_pubkey3 = SchnorrPubkey::FromPubkey(pubkey3);
  SchnorrPubkey schnorr_pubkey31 = schnorr_pubkey3 + tweak1;
  SchnorrPubkey schnorr_pubkey32 = schnorr_pubkey3 + tweak2;

  Script script_a = (ScriptBuilder() << schnorr_pubkey1.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  Script script_b = (ScriptBuilder() << ScriptOperator::OP_TRUE).Build();
  Script script_c = (ScriptBuilder() << schnorr_pubkey11.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();
  // <pubkey_1> CHECKSIGVERIFY ... <pubkey_(n-1)> CHECKSIGVERIFY <pubkey_n> CHECKSIG
  Script script_d = (ScriptBuilder() << schnorr_pubkey11.GetData()
      << ScriptOperator::OP_CHECKSIGVERIFY << schnorr_pubkey12.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  Script script_e = (ScriptBuilder() << ScriptOperator::OP_TRUE).Build();
  // Script script_e = (ScriptBuilder() << schnorr_pubkey2.GetData()
  //     << ScriptOperator::OP_CHECKSIG).Build();

  Script script_f = (ScriptBuilder() << schnorr_pubkey21.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  Script script_g = (ScriptBuilder() << schnorr_pubkey22.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  // <pubkey_1> CHECKSIGVERIFY ... <pubkey_(n-1)> CHECKSIGVERIFY <pubkey_n> CHECKSIG
  Script script_h = (ScriptBuilder() << schnorr_pubkey31.GetData()
      << ScriptOperator::OP_CHECKSIGVERIFY << schnorr_pubkey32.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  Script script_j = (ScriptBuilder() << schnorr_pubkey32.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  EXPECT_EQ("20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac", script_a.GetHex());
  EXPECT_EQ("51", script_b.GetHex());
  EXPECT_EQ("2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aac", script_c.GetHex());
  EXPECT_EQ("2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac", script_d.GetHex());
  EXPECT_EQ("51", script_e.GetHex());
  EXPECT_EQ("2000d134c42fd51c90fa82c6cfdaabd895474d979118525362c0cd236c857e29d9ac", script_f.GetHex());
  EXPECT_EQ("204a7af8660f2b0bdb92d2ce8b88ab30feb916343228d2e7bd15da02e1f6a31d47ac", script_g.GetHex());
  EXPECT_EQ("2008f8280d68e02e807ccffee141c4a6b7ac31d3c283ae0921892d95f691742c44ad20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac", script_h.GetHex());
  EXPECT_EQ("20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac", script_j.GetHex());

  struct TestScriptTree3Data {
    std::string name;
    Script script;
    size_t depth;
    std::vector<ByteData256> nodes;
  };
  std::vector<TestScriptTree3Data> exp_list = {
    {
      "b", script_b, 5,
      {
        ByteData256("06b46c960d6824f0da5af71d9ecc55714de5b2d2da51be60bd12c77df20a20df"),
        ByteData256("4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fd"),
        ByteData256("e47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb"),
        ByteData256("32a0a039ec1412be2803fd7b5f5444c03d498e5e8e107ee431a9597c7b5b3a7c"),
        ByteData256("d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75")
      }
    },
    {
      "e", script_e, 3,
      {
        ByteData256("aaf9ea4cbd2f4606a31a35d563fa371bc630d9d7bcc50f62d064a3d84e0e3086"),
        ByteData256("aeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27e"),
        ByteData256("d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75")
      }
    },
  };

  auto exp_hash = "0c1bebfc9a508bf4d5835d401d96d71b72f1873fd338aebfff06d7adbe0c0cc3";
  auto exp_str = "{{{tl(51),{tl(204a7af8660f2b0bdb92d2ce8b88ab30feb916343228d2e7bd15da02e1f6a31d47ac),tl(2000d134c42fd51c90fa82c6cfdaabd895474d979118525362c0cd236c857e29d9ac)}},{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),{tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aac),tl(51)}},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}},tl(2008f8280d68e02e807ccffee141c4a6b7ac31d3c283ae0921892d95f691742c44ad20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac)}";

  TaprootScriptTree tree_fg(script_f);
  tree_fg.AddBranch(TaprootScriptTree(script_g));
  TaprootScriptTree tree_efg(script_e);
  tree_efg.AddBranch(tree_fg);
  EXPECT_EQ("aaf9ea4cbd2f4606a31a35d563fa371bc630d9d7bcc50f62d064a3d84e0e3086", tree_fg.GetCurrentBranchHash().GetHex());

  TaprootScriptTree tree_b(script_b);
  tree_b.AddBranch(TaprootScriptTree(script_c));
  tree_b.AddBranch(TaprootScriptTree(script_a));
  tree_b.AddBranch(TaprootScriptTree(script_d));
  auto hash_abcd = tree_b.GetCurrentBranchHash();
  tree_b.AddBranch(tree_efg);
  tree_b.AddBranch(TaprootScriptTree(script_h));

  TaprootScriptTree tree = tree_b;
  EXPECT_EQ(exp_hash, tree.GetCurrentBranchHash().GetHex());
  EXPECT_EQ(exp_str, tree.ToString());
  std::string nodes_str;
  for (const auto& node : tree.GetNodeList()) nodes_str += node.GetHex();
  EXPECT_EQ("06b46c960d6824f0da5af71d9ecc55714de5b2d2da51be60bd12c77df20a20df4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fde47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb32a0a039ec1412be2803fd7b5f5444c03d498e5e8e107ee431a9597c7b5b3a7cd7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75", nodes_str);
  EXPECT_EQ("aeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27e", hash_abcd.GetHex());

  for (const auto& test_data : exp_list) {
    SCOPED_TRACE("script_" + test_data.name);
    std::vector<ByteData256> nodes;
    tree = TaprootScriptTree::FromString(exp_str, test_data.script);
    EXPECT_EQ(exp_hash, tree.GetCurrentBranchHash().GetHex());
    EXPECT_EQ(exp_str, tree.ToString());
    if (test_data.name == "b") {
      // see: script_e (duplicated script)
      EXPECT_EQ(exp_list[1].script.GetHex(), tree.GetScript().GetHex());
      EXPECT_EQ(exp_list[1].depth, tree.GetBranchList().size());
      nodes = tree.GetNodeList();
      EXPECT_EQ(exp_list[1].nodes.size(), nodes.size());
      for (size_t index=0; index<nodes.size(); ++index) {
        EXPECT_EQ(exp_list[1].nodes[index], nodes[index]);
      }
    } else {
      EXPECT_EQ(test_data.script.GetHex(), tree.GetScript().GetHex());
      EXPECT_EQ(test_data.depth, tree.GetBranchList().size());
      nodes = tree.GetNodeList();
      EXPECT_EQ(test_data.nodes.size(), nodes.size());
      for (size_t index=0; index<nodes.size(); ++index) {
        EXPECT_EQ(test_data.nodes[index], nodes[index]);
      }
    }

    try {
      tree = TaprootScriptTree::FromString(
          exp_str, test_data.script, test_data.nodes);
      EXPECT_EQ(exp_hash, tree.GetCurrentBranchHash().GetHex());
      EXPECT_EQ(exp_str, tree.ToString());
      EXPECT_EQ(test_data.script.GetHex(), tree.GetScript().GetHex());
      EXPECT_EQ(test_data.depth, tree.GetBranchList().size());
      nodes = tree.GetNodeList();
      EXPECT_EQ(test_data.nodes.size(), nodes.size());
      for (size_t index=0; index<nodes.size(); ++index) {
        EXPECT_EQ(test_data.nodes[index], nodes[index]);
      }
    } catch (const CfdException& except) {
      EXPECT_STREQ("", except.what());
    }
  }
  // invalid leaf
  try {
    tree = TaprootScriptTree::FromString(exp_str, script_j);
    EXPECT_EQ("xxx", tree.GetScript().GetHex());
    EXPECT_EQ("xxx", script_j.GetHex());
  } catch (const CfdException& except) {
    EXPECT_STREQ(
      "This tapscript not exist in this tree.",
      except.what());
  }
}